

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeEnd>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeEnd> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    anon_unknown_31::WebSocketPipeImpl::abort(*(WebSocketPipeImpl **)((long)pointer + 0x10));
    anon_unknown_31::WebSocketPipeImpl::abort(*(WebSocketPipeImpl **)((long)pointer + 0x20));
    Own<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Own
              ((Own<kj::(anonymous_namespace)::WebSocketPipeImpl> *)((long)pointer + 0x18));
    Own<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Own
              ((Own<kj::(anonymous_namespace)::WebSocketPipeImpl> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x28);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }